

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O1

int __thiscall
CVmObjBigNum::getp_format(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  uint uVar2;
  int frac_digits;
  int exp_digits;
  uint uVar3;
  vm_val_t *lead_fill;
  int local_40;
  ulong local_38;
  
  if (argc == (uint *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = *argc;
  }
  if (getp_format(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_format();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_format::desc);
  if (iVar1 == 0) {
    if ((int)uVar3 < 1) {
      local_40 = -1;
    }
    else {
      local_40 = CVmBif::pop_int_or_nil(-1);
    }
    if ((int)uVar3 < 2) {
      local_38 = 0;
    }
    else {
      uVar2 = CVmBif::pop_int_or_nil(0);
      local_38 = (ulong)uVar2;
    }
    frac_digits = -1;
    iVar1 = -1;
    if (2 < (int)uVar3) {
      iVar1 = CVmBif::pop_int_or_nil(-1);
    }
    if (3 < (int)uVar3) {
      frac_digits = CVmBif::pop_int_or_nil(-1);
    }
    exp_digits = -1;
    if (4 < (int)uVar3) {
      exp_digits = CVmBif::pop_int_or_nil(-1);
    }
    lead_fill = (vm_val_t *)0x0;
    if (5 < (int)uVar3) {
      lead_fill = sp_ + -1;
    }
    cvt_to_string(self,retval,(this->super_CVmObject).ext_,local_40,iVar1,frac_digits,exp_digits,
                  local_38,lead_fill);
    if (5 < (int)uVar3) {
      sp_ = sp_ + -1;
    }
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_format(VMG_ vm_obj_id_t self,
                              vm_val_t *retval, uint *argc)
{
    int orig_argc = (argc != 0 ? *argc : 0);
    int max_digits = -1;
    uint flags = 0;
    int whole_places = -1;
    int frac_digits = -1;
    int exp_digits = -1;
    vm_val_t *lead_fill = 0;
    static CVmNativeCodeDesc desc(0, 6);
    
    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the maximum digit count */
    if (orig_argc >= 1)
        max_digits = CVmBif::pop_int_or_nil(vmg_ -1);

    /* get the flags */
    if (orig_argc >= 2)
        flags = CVmBif::pop_int_or_nil(vmg_ 0);

    /* get the whole places */
    if (orig_argc >= 3)
        whole_places = CVmBif::pop_int_or_nil(vmg_ -1);

    /* get the fraction digits */
    if (orig_argc >= 4)
        frac_digits = CVmBif::pop_int_or_nil(vmg_ -1);

    /* get the exponent digits */
    if (orig_argc >= 5)
        exp_digits = CVmBif::pop_int_or_nil(vmg_ -1);

    /* 
     *   get the lead fill string if provided (leave it on the stack to
     *   protect against garbage collection) 
     */
    if (orig_argc >= 6)
        lead_fill = G_stk->get(0);

    /* format the number, which will build the return string */
    cvt_to_string(vmg_ self, retval, ext_, max_digits, whole_places,
                  frac_digits, exp_digits, flags, lead_fill);

    /* discard the lead fill string, if provided */
    if (lead_fill != 0)
        G_stk->discard();

    /* handled */
    return TRUE;
}